

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

void __thiscall QDockWidgetGroupWindow::destroyIfSingleItemLeft(QDockWidgetGroupWindow *this)

{
  QWidget *widget;
  QLayout *pQVar1;
  QMainWindowLayout *this_00;
  long in_FS_OFFSET;
  QList<QDockWidget_*> list;
  QList<int> local_50;
  QArrayData *local_38;
  undefined8 *puStack_30;
  long local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (QArrayData *)0x0;
  puStack_30 = (undefined8 *)0x0;
  local_28 = 0;
  qt_qFindChildren_helper(this,0,0,&QDockWidget::staticMetaObject,&local_38,1);
  if (local_28 == 1) {
    widget = (QWidget *)*puStack_30;
    pQVar1 = QWidget::layout((QWidget *)this);
    QDockAreaLayoutInfo::indexOf
              (&local_50,(QDockAreaLayoutInfo *)&pQVar1[4].super_QLayoutItem,widget);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,4,0x10);
      }
    }
    if (local_50.d.size != 0) {
      this_00 = qt_mainwindow_layout(*(QMainWindow **)(*(long *)(this + 8) + 0x10));
      QMainWindowLayout::unplug((QMainWindowLayout *)this_00,widget,Widget);
      QWidget::setGeometry(widget,(QRect *)(*(long *)(this + 0x20) + 0x14));
      QWidget::hide((QWidget *)this);
      reparentToMainWindow(this,(QDockWidget *)widget);
      pQVar1 = QWidget::layout((QWidget *)this);
      QDockAreaLayoutInfo::deleteAllLayoutItems((QDockAreaLayoutInfo *)&pQVar1[4].super_QLayoutItem)
      ;
      pQVar1 = QWidget::layout((QWidget *)this);
      QList<QDockAreaLayoutItem>::clear((QList<QDockAreaLayoutItem> *)&pQVar1[6].super_QLayoutItem);
      destroyOrHideIfEmpty(this);
    }
  }
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockWidgetGroupWindow::destroyIfSingleItemLeft()
{
    const auto &dockWidgets = this->dockWidgets();

    // Handle only the last dock
    if (dockWidgets.count() != 1)
        return;

    auto *lastDockWidget = dockWidgets.at(0);

    // If the last remaining dock widget is not in the group window's item_list,
    // a group window is being docked on a main window docking area.
    // => don't interfere
    if (layoutInfo()->indexOf(lastDockWidget).isEmpty())
        return;

    Q_ASSERT(qobject_cast<QMainWindow *>(parentWidget()));
    auto *mainWindow = static_cast<QMainWindow *>(parentWidget());
    QMainWindowLayout *mwLayout = qt_mainwindow_layout(mainWindow);

    // Unplug the last remaining dock widget and hide the group window, to avoid flickering
    mwLayout->unplug(lastDockWidget, QDockWidgetPrivate::DragScope::Widget);
    lastDockWidget->setGeometry(geometry());
    hide();

    // Re-parent last dock widget
    reparentToMainWindow(lastDockWidget);

    // the group window could still have placeholder items => clear everything
    layoutInfo()->deleteAllLayoutItems();
    layoutInfo()->item_list.clear();

    destroyOrHideIfEmpty();
}